

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02b.cpp
# Opt level: O2

void day2b::run(void)

{
  int iVar1;
  ostream *poVar2;
  string input;
  
  read_file_abi_cxx11_(&input,"input/day2.txt");
  std::operator<<((ostream *)&std::cout,"day2b ");
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  iVar1 = get_bathroom_code(&input);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2,'\n');
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 2;
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day2.txt");
		std::cout << "day2b ";
		std::cout << std::hex << get_bathroom_code(input) << '\n';
		//std::cout << std::hex << get_bathroom_code("ULL\nRRDDD\nLURDL\nUUUUD") << '\n';
		std::cout << std::dec;
	}